

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rescaler_sse2.c
# Opt level: O2

void RescalerExportRowExpand_SSE2(WebPRescaler *wrk)

{
  __m128i *palVar1;
  __m128i *palVar2;
  uint8_t *puVar3;
  rescaler_t *prVar4;
  undefined1 auVar5 [16];
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  rescaler_t *src;
  long lVar11;
  rescaler_t *src_00;
  __m128i A1;
  __m128i A0;
  __m128i mB;
  __m128i mA;
  __m128i mult;
  __m128i E3;
  __m128i E2;
  __m128i E1;
  __m128i E0;
  __m128i B3;
  __m128i B2;
  __m128i B1;
  __m128i B0;
  __m128i A3;
  __m128i A2;
  ulong local_138;
  ulong uStack_130;
  ulong local_128;
  ulong uStack_120;
  __m128i local_118;
  __m128i local_108;
  ulong local_f8;
  rescaler_t *local_f0;
  __m128i local_e8;
  ulong local_d8;
  ulong uStack_d0;
  ulong local_c8;
  ulong uStack_c0;
  ulong local_b8;
  ulong uStack_b0;
  ulong local_a8;
  ulong uStack_a0;
  long local_98;
  long lStack_90;
  long local_88;
  long lStack_80;
  long local_78;
  long lStack_70;
  long local_68;
  long lStack_60;
  long local_58;
  long lStack_50;
  long local_48;
  long lStack_40;
  
  puVar3 = wrk->dst;
  src = wrk->irow;
  lVar10 = (long)wrk->num_channels * (long)wrk->dst_width;
  prVar4 = wrk->frow;
  local_e8[0] = (ulong)wrk->fy_scale;
  local_e8[1]._0_4_ = wrk->fy_scale;
  local_e8[1]._4_4_ = 0;
  if (wrk->y_accum == 0) {
    lVar11 = 0;
    while (lVar11 + 8 <= lVar10) {
      palVar1 = (__m128i *)(prVar4 + lVar11);
      local_108 = *palVar1;
      palVar2 = (__m128i *)(prVar4 + lVar11 + 4);
      local_118 = *palVar2;
      local_128 = (ulong)(*palVar1)[0] >> 0x20;
      uStack_120 = (ulong)(*palVar1)[1] >> 0x20;
      local_138 = (ulong)(*palVar2)[0] >> 0x20;
      uStack_130 = (ulong)(*palVar2)[1] >> 0x20;
      ProcessRow_SSE2(&local_108,&local_118,(__m128i *)&local_128,(__m128i *)&local_138,&local_e8,
                      puVar3 + lVar11);
      lVar11 = lVar11 + 8;
    }
    for (; lVar11 < lVar10; lVar11 = lVar11 + 1) {
      iVar9 = (int)((ulong)wrk->fy_scale * (ulong)prVar4[lVar11] + 0x80000000 >> 0x20);
      if (0xff < iVar9) {
        iVar9 = 0xff;
      }
      puVar3[lVar11] = (uint8_t)iVar9;
    }
  }
  else {
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (long)wrk->y_sub;
    auVar5 = (ZEXT416((uint)-wrk->y_accum) << 0x20) / auVar5;
    local_f8 = auVar5._0_8_;
    uVar6 = auVar5._0_4_;
    uVar7 = -uVar6;
    local_108[0] = (ulong)uVar7;
    local_108[1]._0_4_ = uVar7;
    local_108[1]._4_4_ = 0;
    local_118[0] = (ulong)uVar6;
    local_118[1]._0_4_ = uVar6;
    local_118[1]._4_4_ = 0;
    lVar11 = 0;
    src_00 = prVar4;
    local_f0 = src;
    while (lVar11 + 8 <= (long)(int)lVar10) {
      LoadDispatchAndMult_SSE2
                (src_00,&local_108,(__m128i *)&local_128,(__m128i *)&local_138,(__m128i *)&local_48,
                 (__m128i *)&local_58);
      LoadDispatchAndMult_SSE2
                (src,&local_118,(__m128i *)&local_68,(__m128i *)&local_78,(__m128i *)&local_88,
                 (__m128i *)&local_98);
      local_a8 = local_128 + local_68 + 0x80000000 >> 0x20;
      uStack_a0 = uStack_120 + lStack_60 + 0x80000000 >> 0x20;
      local_b8 = local_138 + local_78 + 0x80000000 >> 0x20;
      uStack_b0 = uStack_130 + lStack_70 + 0x80000000 >> 0x20;
      local_c8 = local_48 + local_88 + 0x80000000U >> 0x20;
      uStack_c0 = lStack_40 + lStack_80 + 0x80000000U >> 0x20;
      local_d8 = local_58 + local_98 + 0x80000000U >> 0x20;
      uStack_d0 = lStack_50 + lStack_90 + 0x80000000U >> 0x20;
      ProcessRow_SSE2((__m128i *)&local_a8,(__m128i *)&local_b8,(__m128i *)&local_c8,
                      (__m128i *)&local_d8,&local_e8,puVar3 + lVar11);
      src = src + 8;
      src_00 = src_00 + 8;
      lVar11 = lVar11 + 8;
    }
    for (; lVar11 < (int)lVar10; lVar11 = lVar11 + 1) {
      iVar8 = (int)((ulong)wrk->fy_scale *
                    ((ulong)local_f0[lVar11] * (local_f8 & 0xffffffff) +
                     (ulong)prVar4[lVar11] * (ulong)uVar7 + 0x80000000 >> 0x20) + 0x80000000 >> 0x20
                   );
      iVar9 = 0xff;
      if (iVar8 < 0x100) {
        iVar9 = iVar8;
      }
      puVar3[lVar11] = (uint8_t)iVar9;
    }
  }
  return;
}

Assistant:

static void RescalerExportRowExpand_SSE2(WebPRescaler* const wrk) {
  int x_out;
  uint8_t* const dst = wrk->dst;
  rescaler_t* const irow = wrk->irow;
  const int x_out_max = wrk->dst_width * wrk->num_channels;
  const rescaler_t* const frow = wrk->frow;
  const __m128i mult = _mm_set_epi32(0, wrk->fy_scale, 0, wrk->fy_scale);

  assert(!WebPRescalerOutputDone(wrk));
  assert(wrk->y_accum <= 0 && wrk->y_sub + wrk->y_accum >= 0);
  assert(wrk->y_expand);
  if (wrk->y_accum == 0) {
    for (x_out = 0; x_out + 8 <= x_out_max; x_out += 8) {
      __m128i A0, A1, A2, A3;
      LoadDispatchAndMult_SSE2(frow + x_out, NULL, &A0, &A1, &A2, &A3);
      ProcessRow_SSE2(&A0, &A1, &A2, &A3, &mult, dst + x_out);
    }
    for (; x_out < x_out_max; ++x_out) {
      const uint32_t J = frow[x_out];
      const int v = (int)MULT_FIX(J, wrk->fy_scale);
      dst[x_out] = (v > 255) ? 255u : (uint8_t)v;
    }
  } else {
    const uint32_t B = WEBP_RESCALER_FRAC(-wrk->y_accum, wrk->y_sub);
    const uint32_t A = (uint32_t)(WEBP_RESCALER_ONE - B);
    const __m128i mA = _mm_set_epi32(0, A, 0, A);
    const __m128i mB = _mm_set_epi32(0, B, 0, B);
    const __m128i rounder = _mm_set_epi32(0, ROUNDER, 0, ROUNDER);
    for (x_out = 0; x_out + 8 <= x_out_max; x_out += 8) {
      __m128i A0, A1, A2, A3, B0, B1, B2, B3;
      LoadDispatchAndMult_SSE2(frow + x_out, &mA, &A0, &A1, &A2, &A3);
      LoadDispatchAndMult_SSE2(irow + x_out, &mB, &B0, &B1, &B2, &B3);
      {
        const __m128i C0 = _mm_add_epi64(A0, B0);
        const __m128i C1 = _mm_add_epi64(A1, B1);
        const __m128i C2 = _mm_add_epi64(A2, B2);
        const __m128i C3 = _mm_add_epi64(A3, B3);
        const __m128i D0 = _mm_add_epi64(C0, rounder);
        const __m128i D1 = _mm_add_epi64(C1, rounder);
        const __m128i D2 = _mm_add_epi64(C2, rounder);
        const __m128i D3 = _mm_add_epi64(C3, rounder);
        const __m128i E0 = _mm_srli_epi64(D0, WEBP_RESCALER_RFIX);
        const __m128i E1 = _mm_srli_epi64(D1, WEBP_RESCALER_RFIX);
        const __m128i E2 = _mm_srli_epi64(D2, WEBP_RESCALER_RFIX);
        const __m128i E3 = _mm_srli_epi64(D3, WEBP_RESCALER_RFIX);
        ProcessRow_SSE2(&E0, &E1, &E2, &E3, &mult, dst + x_out);
      }
    }
    for (; x_out < x_out_max; ++x_out) {
      const uint64_t I = (uint64_t)A * frow[x_out]
                       + (uint64_t)B * irow[x_out];
      const uint32_t J = (uint32_t)((I + ROUNDER) >> WEBP_RESCALER_RFIX);
      const int v = (int)MULT_FIX(J, wrk->fy_scale);
      dst[x_out] = (v > 255) ? 255u : (uint8_t)v;
    }
  }
}